

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quaternion_motion_blur.cpp
# Opt level: O1

void __thiscall embree::Tutorial::drawGUI(Tutorial *this)

{
  bool bVar1;
  float *v;
  char *label;
  
  bVar1 = ImGui::SliderInt("samples per pixel",&g_spp,1,0x20,"%d",0);
  if (bVar1) {
    g_reset = true;
  }
  bVar1 = ImGui::SliderInt("time steps",&g_numTimeSteps,3,10,"%d",0);
  if (bVar1) {
    g_reset = true;
  }
  bVar1 = ImGui::Checkbox("animate",&g_animate);
  if (bVar1) {
    g_reset = true;
  }
  bVar1 = ImGui::Checkbox("motion blur",&g_motion_blur);
  if (bVar1) {
    g_reset = true;
  }
  if (g_motion_blur == false) {
    label = "time";
    v = &g_time;
  }
  else {
    label = "shutter close";
    v = &g_shutter_close;
  }
  bVar1 = ImGui::SliderFloat(label,v,0.0,1.0,"%.3f",0);
  if (bVar1) {
    g_reset = true;
  }
  if (g_drawGUI != (DrawGUI)0x0) {
    (*g_drawGUI)();
    return;
  }
  return;
}

Assistant:

void drawGUI() override
    {
      if (ImGui::SliderInt ("samples per pixel",  &g_spp, 1, 32))  g_reset = true;
      if (ImGui::SliderInt ("time steps",  &g_numTimeSteps, 3, 10))  g_reset = true;
      if (ImGui::Checkbox ("animate", &g_animate)) g_reset = true;
      if (ImGui::Checkbox ("motion blur", &g_motion_blur)) g_reset = true;
      if (!g_motion_blur) {
        if (ImGui::SliderFloat ("time", &g_time, 0.f, 1.f)) g_reset = true;
      } else {
        if (ImGui::SliderFloat ("shutter close", &g_shutter_close, 0.f, 1.f)) g_reset = true;
      }
      if (g_drawGUI)
        g_drawGUI();
    }